

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullseq.c
# Opt level: O3

int main(int argc,char **argv)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  bool bVar5;
  bool bVar6;
  char *__s1;
  char *aStrRegex;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  int *piVar10;
  FILE *__stream;
  lookup_t *plVar11;
  size_t sVar12;
  byte *__dest;
  UT_hash_table *pUVar13;
  UT_hash_table *pUVar14;
  UT_hash_bucket *pUVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  UT_hash_handle *pUVar23;
  lookup_t *plVar24;
  int local_78;
  uint local_74;
  uint local_70;
  char *end;
  undefined8 local_60;
  undefined8 local_58;
  uint local_50;
  int option_index;
  char *local_48;
  char *local_40;
  char *local_38;
  
  verbose_flag = 0;
  progname = *argv;
  if (3 < argc) {
    local_74 = 0x32;
    local_50 = 0xffffffff;
    local_40 = (char *)0x0;
    local_48 = (char *)0x0;
    local_70 = 0xffffffff;
    bVar6 = false;
    local_78 = 0;
    local_60 = 0;
    local_58 = 0;
    local_38 = (char *)0x0;
LAB_00102bf0:
    while( true ) {
      option_index = 0;
      iVar7 = getopt_long(argc,argv,"Vvh?cetq:i:g:Nn:m:a:l:",main::long_options,&option_index);
      aStrRegex = local_38;
      __s1 = local_40;
      pcVar9 = local_48;
      uVar8 = local_50;
      pcVar20 = _optarg;
      if (0x55 < iVar7) break;
      if (iVar7 != 0x3f) {
        if (iVar7 != 0x4e) {
          if (iVar7 == -1) {
            if (verbose_flag != 0) {
              fwrite("verbose flag is set\n",0x14,1,_stderr);
              fprintf(_stderr,"Input is %s\n",__s1);
              if ((int)local_58 != 0) {
                main_cold_5();
              }
              if (bVar6) {
                if (local_78 == 0) {
                  main_cold_7();
                }
                else {
                  main_cold_6();
                }
              }
              else if (pcVar9 != (char *)0x0) {
                if (local_78 == 0) {
                  pcVar20 = "Names in %s will be included\n";
                }
                else {
                  pcVar20 = "Names in %s will be excluded\n";
                }
                fprintf(_stderr,pcVar20,pcVar9);
              }
              if (aStrRegex != (char *)0x0) {
                pcVar20 = "Only sequences not matching %s will be output\n";
                if (local_78 == 0) {
                  pcVar20 = "Only sequences matching %s will be output\n";
                }
                fprintf(_stderr,pcVar20,aStrRegex);
              }
              if (0 < (int)local_70) {
                fprintf(_stderr,"Only sequences less than %i will be output\n",(ulong)local_70);
              }
              if (0 < (int)uVar8) {
                fprintf(_stderr,"Only sequences greater than %i will be output\n",(ulong)uVar8);
              }
              if (0 < (int)local_74) {
                fprintf(_stderr,"Output will be %i columns long\n",(ulong)local_74);
              }
              if (0 < (int)local_60) {
                main_cold_8();
              }
            }
            if (__s1 == (char *)0x0) {
              main_cold_14();
              return 1;
            }
            bVar5 = bVar6;
            if (pcVar9 != (char *)0x0) {
              iVar7 = strcmp(__s1,pcVar9);
              if (iVar7 == 0) {
                main_cold_10();
                return 1;
              }
              bVar5 = true;
              if (bVar6) {
                main_cold_9();
                return 1;
              }
            }
            if ((bool)(aStrRegex != (char *)0x0 & bVar5)) {
              main_cold_13();
              return 1;
            }
            if ((int)local_70 <= (int)uVar8 && (0 < (int)local_70 && 0 < (int)uVar8)) {
              main_cold_11();
              return 1;
            }
            if (bVar5) {
              __stream = _stdin;
              if ((pcVar9 == (char *)0x0) || (__stream = fopen(pcVar9,"r"), __stream != (FILE *)0x0)
                 ) {
                uVar8 = pull_by_name(__s1,(FILE *)__stream,uVar8,local_70,local_74,local_78,
                                     (int)local_58,(int)local_60);
                free(__s1);
                if (pcVar9 != (char *)0x0) {
                  free(pcVar9);
                }
                if (__stream != (FILE *)0x0) {
                  fclose(__stream);
                }
                goto LAB_00102fad;
              }
              main_cold_12();
            }
            if (aStrRegex == (char *)0x0) {
              uVar8 = pull_by_size(__s1,uVar8,local_70,local_74,(int)local_58,(int)local_60);
            }
            else {
              uVar8 = pull_by_re(__s1,aStrRegex,uVar8,local_70,local_74,local_78,(int)local_58,
                                 (int)local_60);
            }
            free(__s1);
LAB_00102fad:
            if (aStrRegex != (char *)0x0) {
              free(aStrRegex);
            }
            if (verbose_flag != 0) {
              fprintf(_stderr,"Pulled %i entries\n",(ulong)uVar8);
            }
            fclose(_stderr);
            fclose(_stdout);
            fclose(_stdin);
            return 0;
          }
switchD_00102c21_caseD_62:
          abort();
        }
        bVar6 = true;
      }
    }
    switch(iVar7) {
    case 0x61:
      strtol(_optarg,&end,0);
      if ((*end == '\0') && (piVar10 = __errno_location(), *piVar10 == 0)) {
        local_70 = atoi(_optarg);
        goto LAB_00102bf0;
      }
      main_cold_3();
      break;
    case 0x62:
    case 100:
    case 0x66:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x73:
    case 0x75:
      goto switchD_00102c21_caseD_62;
    case 99:
      QUALITY_SCORE = 0x3d;
      local_58 = 1;
      goto LAB_00102bf0;
    case 0x65:
      local_78 = 1;
      goto LAB_00102bf0;
    case 0x67:
      sVar12 = strlen(_optarg);
      pcVar9 = (char *)malloc(sVar12 + 1);
      local_38 = pcVar9;
      goto LAB_00102de2;
    case 0x68:
      goto switchD_00102c21_caseD_68;
    case 0x69:
      sVar12 = strlen(_optarg);
      pcVar9 = (char *)malloc(sVar12 + 1);
      local_40 = pcVar9;
      goto LAB_00102de2;
    case 0x6c:
      strtol(_optarg,&end,0);
      if ((*end == '\0') && (piVar10 = __errno_location(), *piVar10 == 0)) {
        local_74 = atoi(_optarg);
        goto LAB_00102bf0;
      }
      main_cold_1();
      break;
    case 0x6d:
      strtol(_optarg,&end,0);
      if ((*end == '\0') && (piVar10 = __errno_location(), *piVar10 == 0)) {
        local_50 = atoi(_optarg);
        goto LAB_00102bf0;
      }
      main_cold_4();
      break;
    case 0x6e:
      sVar12 = strlen(_optarg);
      pcVar9 = (char *)malloc(sVar12 + 1);
      local_48 = pcVar9;
LAB_00102de2:
      strcpy(pcVar9,pcVar20);
      goto LAB_00102bf0;
    case 0x71:
      strtol(_optarg,&end,0);
      if ((*end == '\0') && (piVar10 = __errno_location(), *piVar10 == 0)) {
        QUALITY_SCORE = atoi(_optarg);
        goto LAB_00102bf0;
      }
      main_cold_2();
      break;
    case 0x74:
      local_60 = 1;
      goto LAB_00102bf0;
    case 0x76:
      verbose_flag = 1;
      goto LAB_00102bf0;
    default:
      if (iVar7 == 0x56) goto code_r0x00102c8e;
      goto switchD_00102c21_caseD_62;
    }
    return 1;
  }
switchD_00102c21_caseD_68:
  pcVar20 = (char *)0x1;
  show_usage(1);
  plVar11 = (lookup_t *)malloc(0x40);
  if (plVar11 == (lookup_t *)0x0) {
    add_name_cold_2();
  }
  else {
    sVar12 = strlen(pcVar20);
    __dest = (byte *)malloc(sVar12 * 8 + 8);
    plVar11->name = (char *)__dest;
    if (__dest != (byte *)0x0) {
      strncpy((char *)__dest,pcVar20,sVar12 + 1);
      pUVar23 = &plVar11->hh;
      (plVar11->hh).next = (void *)0x0;
      (plVar11->hh).key = __dest;
      sVar12 = strlen((char *)__dest);
      (plVar11->hh).keylen = (uint)sVar12;
      plVar24 = lookup;
      if (lookup == (lookup_t *)0x0) {
        lookup = plVar11;
        (plVar11->hh).prev = (void *)0x0;
        pUVar13 = (UT_hash_table *)calloc(1,0x40);
        (plVar11->hh).tbl = pUVar13;
        if (pUVar13 == (UT_hash_table *)0x0) goto LAB_00103640;
        pUVar13->tail = pUVar23;
        pUVar13->num_buckets = 0x20;
        pUVar13->log2_num_buckets = 5;
        pUVar13->hho = 8;
        pUVar15 = (UT_hash_bucket *)calloc(1,0x200);
        pUVar13->buckets = pUVar15;
        if (pUVar15 == (UT_hash_bucket *)0x0) goto LAB_00103640;
        pUVar13->signature = 0xa0111fe1;
        plVar24 = plVar11;
      }
      else {
        pUVar13 = (lookup->hh).tbl;
        pUVar2 = pUVar13->tail;
        pUVar2->next = plVar11;
        (plVar11->hh).prev = (void *)((long)pUVar2 - pUVar13->hho);
        pUVar13->tail = pUVar23;
      }
      uVar17 = pUVar13->num_items + 1;
      pUVar13->num_items = uVar17;
      (plVar11->hh).tbl = pUVar13;
      sVar12 = strlen((char *)__dest);
      uVar8 = (uint)sVar12;
      if (uVar8 < 0xc) {
        uVar18 = 0x9e3779b9;
        uVar16 = 0xfeedbeef;
        uVar19 = 0x9e3779b9;
        uVar22 = uVar8;
      }
      else {
        uVar19 = 0x9e3779b9;
        uVar16 = 0xfeedbeef;
        uVar18 = 0x9e3779b9;
        uVar21 = sVar12 & 0xffffffff;
        do {
          uVar16 = uVar16 + *(int *)(__dest + 8);
          uVar22 = uVar16 >> 0xd ^
                   ((uVar19 + *(int *)__dest) - (uVar18 + *(int *)(__dest + 4))) - uVar16;
          uVar18 = uVar22 << 8 ^ ((uVar18 + *(int *)(__dest + 4)) - uVar16) - uVar22;
          uVar16 = uVar18 >> 0xd ^ (uVar16 - uVar22) - uVar18;
          uVar22 = uVar16 >> 0xc ^ (uVar22 - uVar18) - uVar16;
          uVar18 = uVar22 << 0x10 ^ (uVar18 - uVar16) - uVar22;
          uVar16 = uVar18 >> 5 ^ (uVar16 - uVar22) - uVar18;
          uVar19 = uVar16 >> 3 ^ (uVar22 - uVar18) - uVar16;
          uVar18 = uVar19 << 10 ^ (uVar18 - uVar16) - uVar19;
          uVar16 = uVar18 >> 0xf ^ (uVar16 - uVar19) - uVar18;
          __dest = __dest + 0xc;
          uVar22 = (int)uVar21 - 0xc;
          uVar21 = (ulong)uVar22;
        } while (0xb < uVar22);
      }
      uVar16 = uVar16 + uVar8;
      (plVar11->hh).hashv = uVar16;
      switch(uVar22) {
      case 0xb:
        uVar16 = (uint)__dest[10] * 0x1000000 + uVar16;
        (plVar11->hh).hashv = uVar16;
      case 10:
        uVar16 = (uint)__dest[9] * 0x10000 + uVar16;
        (plVar11->hh).hashv = uVar16;
      case 9:
        uVar16 = (uint)__dest[8] * 0x100 + uVar16;
        (plVar11->hh).hashv = uVar16;
      case 8:
        uVar18 = (uint)__dest[7] * 0x1000000 + uVar18;
      case 7:
        uVar18 = (uint)__dest[6] * 0x10000 + uVar18;
      case 6:
        uVar18 = (uint)__dest[5] * 0x100 + uVar18;
      case 5:
        uVar18 = __dest[4] + uVar18;
      case 4:
        uVar19 = (uint)__dest[3] * 0x1000000 + uVar19;
      case 3:
        uVar19 = (uint)__dest[2] * 0x10000 + uVar19;
      case 2:
        uVar19 = (uint)__dest[1] * 0x100 + uVar19;
      case 1:
        uVar19 = *__dest + uVar19;
      }
      uVar8 = uVar16 >> 0xd ^ (uVar19 - uVar18) - uVar16;
      uVar18 = uVar8 << 8 ^ (uVar18 - uVar16) - uVar8;
      uVar16 = uVar18 >> 0xd ^ (uVar16 - uVar8) - uVar18;
      uVar22 = uVar16 >> 0xc ^ (uVar8 - uVar18) - uVar16;
      uVar8 = uVar22 << 0x10 ^ (uVar18 - uVar16) - uVar22;
      uVar16 = uVar8 >> 5 ^ (uVar16 - uVar22) - uVar8;
      uVar22 = uVar16 >> 3 ^ (uVar22 - uVar8) - uVar16;
      uVar8 = uVar22 << 10 ^ (uVar8 - uVar16) - uVar22;
      uVar8 = uVar8 >> 0xf ^ uVar16 - (uVar22 + uVar8);
      (plVar11->hh).hashv = uVar8;
      pUVar14 = (plVar24->hh).tbl;
      pUVar15 = pUVar14->buckets;
      pUVar14 = (UT_hash_table *)((ulong)(pUVar14->num_buckets - 1 & uVar8) * 0x10);
      piVar10 = (int *)((long)&pUVar14->num_buckets + (long)pUVar15);
      *piVar10 = *piVar10 + 1;
      pUVar2 = *(UT_hash_handle **)((long)&pUVar14->buckets + (long)pUVar15);
      (plVar11->hh).hh_next = pUVar2;
      (plVar11->hh).hh_prev = (UT_hash_handle *)0x0;
      if (pUVar2 != (UT_hash_handle *)0x0) {
        pUVar2->hh_prev = pUVar23;
      }
      *(UT_hash_handle **)((long)&pUVar14->buckets + (long)pUVar15) = pUVar23;
      pUVar15 = ((lookup->hh).tbl)->buckets;
      if ((*(uint *)((long)&pUVar14->num_buckets + (long)pUVar15) <
           *(int *)((long)&pUVar14->log2_num_buckets + (long)pUVar15) * 10 + 10U) ||
         (pUVar13->noexpand == 1)) {
LAB_00103627:
        return (int)pUVar14;
      }
      uVar8 = pUVar13->num_buckets;
      pUVar15 = (UT_hash_bucket *)calloc(1,(ulong)(uVar8 * 2) << 4);
      if (pUVar15 != (UT_hash_bucket *)0x0) {
        uVar22 = uVar8 * 2 - 1;
        uVar17 = ((uVar17 >> ((char)pUVar13->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar22 & uVar17) == 0);
        pUVar13->ideal_chain_maxlen = uVar17;
        pUVar13->nonideal_items = 0;
        __ptr = pUVar13->buckets;
        if ((ulong)uVar8 != 0) {
          uVar16 = 0;
          uVar21 = 0;
          do {
            pUVar2 = __ptr[uVar21].hh_head;
            while (pUVar2 != (UT_hash_handle *)0x0) {
              pUVar3 = pUVar2->hh_next;
              uVar19 = pUVar2->hashv & uVar22;
              pUVar1 = pUVar15 + uVar19;
              uVar18 = pUVar15[uVar19].count + 1;
              pUVar15[uVar19].count = uVar18;
              if (uVar17 < uVar18) {
                uVar16 = uVar16 + 1;
                pUVar13->nonideal_items = uVar16;
                pUVar1->expand_mult = uVar18 / uVar17;
              }
              pUVar2->hh_prev = (UT_hash_handle *)0x0;
              pUVar4 = pUVar1->hh_head;
              pUVar2->hh_next = pUVar4;
              if (pUVar4 != (UT_hash_handle *)0x0) {
                pUVar4->hh_prev = pUVar2;
              }
              pUVar1->hh_head = pUVar2;
              pUVar2 = pUVar3;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar8);
        }
        free(__ptr);
        pUVar14 = pUVar23->tbl;
        pUVar14->num_buckets = pUVar14->num_buckets << 1;
        pUVar14->log2_num_buckets = pUVar14->log2_num_buckets + 1;
        pUVar14->buckets = pUVar15;
        if (pUVar14->num_items >> 1 < pUVar14->nonideal_items) {
          uVar8 = pUVar14->ineff_expands + 1;
          pUVar14->ineff_expands = uVar8;
          if (1 < uVar8) {
            pUVar14->noexpand = 1;
          }
        }
        else {
          pUVar14->ineff_expands = 0;
        }
        goto LAB_00103627;
      }
      goto LAB_00103640;
    }
  }
  add_name_cold_1();
LAB_00103640:
  exit(-1);
code_r0x00102c8e:
  printf("Version is %s\n","1.0.2");
  goto LAB_00102bf0;
}

Assistant:

int main(int argc, char *argv[]) {
	int c;
	char *in = NULL,*names = NULL;
	FILE *names_fp = NULL;
	int min = -1, max = -1;
	int names_from_stdin = 0;
	int exclude = 0;
	int count = 0;
	int just_count = 0; /* flag for just counting the output */
	int convert = 0;
	int length = 50;
	long value;
	char *end;
	char *aStrRegex = NULL;

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */

	progname = argv[0];
	if (argc < 4) { /* progname + at least 3 other args */
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",     no_argument,       0, 'v'},
			{"convert",     no_argument,       0, 'c'},
			{"exclude",     no_argument,       0, 'e'},
			{"count",       no_argument,       0, 't'},
			{"version",     no_argument,       0, 'V'},
			{"help",        no_argument,       0, 'h'},
			{"input",       required_argument, 0, 'i'},
			{"regex",       required_argument, 0, 'g'},
			{"names",       required_argument, 0, 'n'},
			{"names_stdin", no_argument,       0, 'N'},
			{"min",         required_argument, 0, 'm'},
			{"max",         required_argument, 0, 'a'},
			{"length",      required_argument, 0, 'l'},
			{"quality",     required_argument, 0, 'q'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long (argc, argv, "Vvh?cetq:i:g:Nn:m:a:l:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'i':
				in = (char*) malloc(strlen(optarg)+1);
				strcpy(in,optarg);
				break;

			case 'g':
				aStrRegex = (char*) malloc(strlen(optarg)+1);
				strcpy(aStrRegex, optarg);
				break;

			case 'n':
				names = (char*) malloc(strlen(optarg)+1);
				strcpy(names, optarg);
				break;

			case 'N':
				names_from_stdin = 1;
				break;

			case 'm':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					min = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-m) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'a':
				value = strtol(optarg, &end, 0);
				if (*end == '\0' && errno == 0) {
					max = atoi(optarg);
				} else {
					fprintf(stderr, "Maximum value (-a) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'c':
				convert = 1;
				QUALITY_SCORE = 61;
				break;

			case 't':
				just_count = 1;
				break;

			case 'q':
				value = strtol(optarg, &end, 0);
				if (*end == 0 && errno == 0) {
					QUALITY_SCORE = atoi(optarg);
				} else {
					fprintf(stderr, "Quality ASCII value (-q) is invalid - must be an ASCII code (e.g. 73, which is 'I')\n");
					return EXIT_FAILURE;
				}
				break;

			case 'e':
				exclude = 1;
				break;

			case 'l':
				value = strtol(optarg, &end,0);
				if (*end == '\0' && errno == 0) {
					length = atoi(optarg);
				} else {
					fprintf(stderr, "Sequence length value (-l) argument '%s' is not an integer\n", optarg);
					return EXIT_FAILURE;
				}
				break;

			case 'V':
				/* version */
				printf("Version is %s\n", PULLSEQ_VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"Input is %s\n", in);
		if (convert)
			fprintf(stderr,"Input will be converted between FASTQ and FASTA\n");
		if (names_from_stdin) {
			if (exclude)
				fprintf(stderr,"Names in STDIN will be excluded\n");
			else
				fprintf(stderr,"Names in STDIN will be included\n");

		} else if (names != NULL) {
			if (exclude) {
				fprintf(stderr,"Names in %s will be excluded\n", names);
            }
			else {
				fprintf(stderr,"Names in %s will be included\n", names);
            }
		}
		if (aStrRegex)
			if (exclude) {
				fprintf(stderr,"Only sequences not matching %s will be output\n", aStrRegex);
            }
			else {
				fprintf(stderr,"Only sequences matching %s will be output\n", aStrRegex);
            }
		if (max > 0)
			fprintf(stderr,"Only sequences less than %i will be output\n", max);
		if (min > 0)
			fprintf(stderr,"Only sequences greater than %i will be output\n", min);
		if (length > 0)
			fprintf(stderr,"Output will be %i columns long\n", length);
		if (just_count > 0)
			fprintf(stderr,"Output will be counted only\n");
	}

	/* check validity of given argument set */
	if (!in) {
		fprintf (stderr, "Error: Input file is required.\n");
		return EXIT_FAILURE;
	}

	if (names) {
		if (!strcmp(in, names)) {
			fprintf (stderr, "Error: Input file is same as names file.\n");
			return EXIT_FAILURE;
		}
	}

	if (names && names_from_stdin) {
		fprintf (stderr, "Error: Cannot use names from STDIN *and* names from a file.\n");
		return EXIT_FAILURE;
	}

	if (aStrRegex) {
		if (names || names_from_stdin) {
			fprintf (stderr, "Error: You can't use a names file or names from STDIN and a regex match.\n");
			return EXIT_FAILURE;
		}
	}

	if (min > 0 && max > 0) {
		if (max <= min) {
			fprintf (stderr, "Error: Max is less than or equal to min.\n");
			return EXIT_FAILURE;
		}
	}

	if (names || names_from_stdin) {
		if (names) {
			names_fp = fopen(names,"r");
			if (!names_fp) {
				fprintf(stderr,"%s - failed to open names file %s\n",progname, names);
				exit(EXIT_FAILURE);
			}
		} else {
			names_fp = stdin;
		}
		count = pull_by_name(in, names_fp, min, max, length, exclude, convert, just_count);
	} else if (aStrRegex) {
		count = pull_by_re(in, aStrRegex, min, max, length, exclude, convert, just_count);
	} else {
		count = pull_by_size(in, min, max, length, convert, just_count);
	}

	/* free up memory */
	free(in);

	if (names)
		free(names);

	if (names_fp)
		fclose(names_fp);

	if (aStrRegex)
		free(aStrRegex);

	if (verbose_flag)
		fprintf(stderr,"Pulled %i entries\n",count);

	/* close streams */
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}